

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionhandler.c
# Opt level: O2

OPTIONHANDLER_RESULT OptionHandler_AddOption(OPTIONHANDLER_HANDLE handle,char *name,void *value)

{
  OPTIONHANDLER_RESULT OVar1;
  LOGGER_LOG p_Var2;
  
  if ((name == (char *)0x0 || handle == (OPTIONHANDLER_HANDLE)0x0) || value == (void *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/src/optionhandler.c"
                ,"OptionHandler_AddOption",0xd5,1,
                "invalid arguments: OPTIONHANDLER_HANDLE handle=%p, const char* name=%p, void* value=%p"
                ,handle,name,value);
    }
    return OPTIONHANDLER_INVALIDARG;
  }
  OVar1 = AddOptionInternal(handle,name,value);
  return OVar1;
}

Assistant:

OPTIONHANDLER_RESULT OptionHandler_AddOption(OPTIONHANDLER_HANDLE handle, const char* name, const void* value)
{
    OPTIONHANDLER_RESULT result;
    /*Codes_SRS_OPTIONHANDLER_02_001: [ OptionHandler_Create shall fail and retun NULL if any parameters are NULL. ]*/
    if (
        (handle == NULL) ||
        (name == NULL) ||
        (value == NULL)
        )
    {
        LogError("invalid arguments: OPTIONHANDLER_HANDLE handle=%p, const char* name=%p, void* value=%p", handle, name, value);
        result= OPTIONHANDLER_INVALIDARG;
    }
    else
    {
        result = AddOptionInternal(handle, name, value);
    }

    return result;
}